

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::ModuleRoot::HasPropertyQuery(ModuleRoot *this,PropertyId propertyId,PropertyValueInfo *info)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  HostObjectBase **ppHVar2;
  JavascriptLibrary *this_00;
  GlobalObject *this_01;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  val = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 == 0) {
    ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar2 != (HostObjectBase *)0x0) {
      ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      BVar1 = Js::JavascriptOperators::HasProperty((RecyclableObject *)*ppHVar2,propertyId);
      if (BVar1 != 0) {
        return Property_Found;
      }
    }
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_01 = JavascriptLibrary::GetGlobalObject(this_00);
    this_local._4_4_ = GlobalObject::HasPropertyQuery(this_01,propertyId,info);
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags ModuleRoot::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        else if (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::HasPropertyQuery(propertyId, info);
    }